

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O3

Clifford * operator-(Clifford *__return_storage_ptr__,Clifford *A,Clifford *B)

{
  pointer *ppBVar1;
  int tBase;
  int tBase_00;
  iterator iVar2;
  Blade in_RAX;
  pointer pBVar3;
  pointer pBVar4;
  pointer pBVar5;
  pointer pBVar6;
  float tVal;
  Blade local_38;
  
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pBVar6 = (A->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pBVar4 = (A->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  pBVar5 = (B->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pBVar3 = pBVar6;
  local_38 = in_RAX;
  if ((pBVar6 != pBVar4) &&
     (pBVar3 = pBVar4,
     pBVar5 != (B->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
               super__Vector_impl_data._M_finish)) {
    do {
      tBase = pBVar6->mBase;
      tBase_00 = pBVar5->mBase;
      if (tBase < tBase_00) {
        Blade::Blade(&local_38,tBase,pBVar6->mVal);
        iVar2._M_current =
             (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Blade,_std::allocator<Blade>_>::_M_realloc_insert<Blade>
                    (__return_storage_ptr__,iVar2,&local_38);
        }
        else {
          *iVar2._M_current = local_38;
          ppBVar1 = &(__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppBVar1 = *ppBVar1 + 1;
        }
        Blade::~Blade(&local_38);
        pBVar6 = pBVar6 + 1;
      }
      else {
        if (tBase == tBase_00) {
          tVal = pBVar6->mVal - pBVar5->mVal;
          if (1e-06 < ABS(tVal)) {
            Blade::Blade(&local_38,tBase,tVal);
            iVar2._M_current =
                 (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl
                 .super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<Blade,_std::allocator<Blade>_>::_M_realloc_insert<Blade>
                        (__return_storage_ptr__,iVar2,&local_38);
            }
            else {
              *iVar2._M_current = local_38;
              ppBVar1 = &(__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppBVar1 = *ppBVar1 + 1;
            }
            Blade::~Blade(&local_38);
          }
          pBVar6 = pBVar6 + 1;
        }
        else {
          Blade::Blade(&local_38,tBase_00,-pBVar5->mVal);
          iVar2._M_current =
               (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<Blade,_std::allocator<Blade>_>::_M_realloc_insert<Blade>
                      (__return_storage_ptr__,iVar2,&local_38);
          }
          else {
            *iVar2._M_current = local_38;
            ppBVar1 = &(__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppBVar1 = *ppBVar1 + 1;
          }
          Blade::~Blade(&local_38);
        }
        pBVar5 = pBVar5 + 1;
      }
      pBVar4 = (A->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pBVar3 = pBVar6;
    } while ((pBVar6 != pBVar4) &&
            (pBVar3 = pBVar4,
            pBVar5 != (B->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
                      super__Vector_impl_data._M_finish));
  }
  pBVar4 = (B->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (pBVar5 != pBVar4) {
    do {
      if (1e-06 < ABS(pBVar5->mVal)) {
        Blade::Blade(&local_38,pBVar5->mBase,-pBVar5->mVal);
        iVar2._M_current =
             (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Blade,_std::allocator<Blade>_>::_M_realloc_insert<Blade>
                    (__return_storage_ptr__,iVar2,&local_38);
        }
        else {
          *iVar2._M_current = local_38;
          ppBVar1 = &(__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppBVar1 = *ppBVar1 + 1;
        }
        Blade::~Blade(&local_38);
        pBVar4 = (B->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      pBVar5 = pBVar5 + 1;
    } while (pBVar5 != pBVar4);
    pBVar3 = (A->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
  }
  if (pBVar6 != pBVar3) {
    do {
      if (1e-06 < ABS(pBVar6->mVal)) {
        Blade::Blade(&local_38,pBVar6->mBase,pBVar6->mVal);
        iVar2._M_current =
             (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Blade,_std::allocator<Blade>_>::_M_realloc_insert<Blade>
                    (__return_storage_ptr__,iVar2,&local_38);
        }
        else {
          *iVar2._M_current = local_38;
          ppBVar1 = &(__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppBVar1 = *ppBVar1 + 1;
        }
        Blade::~Blade(&local_38);
        pBVar3 = (A->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      pBVar6 = pBVar6 + 1;
    } while (pBVar6 != pBVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

Clifford operator-(Clifford A, Clifford B) {
	Clifford C; 
	idx a=A.begin();
	idx b=B.begin();
	while(a!=A.end()&&b!=B.end())
	{
		//switch
		int d=(a->mBase)-(b->mBase);
		if(d<0)
		{C.push_back(Blade(a->mBase,a->mVal));a++;}
		else if(d>0)
		{C.push_back(Blade(b->mBase,-b->mVal));b++;}
		else if(0==d)
		{
			float Val=a->mVal-b->mVal;
			if(fabs(Val)>Error2){C.push_back(Blade(a->mBase,Val));}
			a++;b++;
		}
	}
	while(b!=B.end())
	{	
		if(fabs(b->mVal)>Error2){C.push_back(Blade(b->mBase,-b->mVal));}
		b++;
	}
	while(a!=A.end())
	{	
		if(fabs(a->mVal)>Error2){C.push_back(Blade(a->mBase,a->mVal));}
		a++;
	}
  return C;
}